

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlDocPtr xmlReadFile(char *filename,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  ctxt = xmlNewParserCtxt();
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    pxVar1 = (xmlDocPtr)0x0;
  }
  else {
    xmlCtxtUseOptions(ctxt,options | 0x1000000);
    if (((filename == (char *)0x0) || (*filename != '-')) || (filename[1] != '\0')) {
      input = xmlCtxtNewInputFromUrl(ctxt,filename,(char *)0x0,encoding,0);
    }
    else {
      input = xmlCtxtNewInputFromFd(ctxt,filename,0,encoding,0);
    }
    if (input == (xmlParserInputPtr)0x0) {
      pxVar1 = (xmlDocPtr)0x0;
    }
    else {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return pxVar1;
}

Assistant:

xmlDocPtr
xmlReadFile(const char *filename, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    options |= XML_PARSE_UNZIP;

    xmlCtxtUseOptions(ctxt, options);

    /*
     * Backward compatibility for users of command line utilities like
     * xmlstarlet expecting "-" to mean stdin. This is dangerous and
     * should be removed at some point.
     */
    if ((filename != NULL) && (filename[0] == '-') && (filename[1] == 0))
        input = xmlCtxtNewInputFromFd(ctxt, filename, STDIN_FILENO,
                                      encoding, 0);
    else
        input = xmlCtxtNewInputFromUrl(ctxt, filename, NULL, encoding, 0);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}